

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_block.h
# Opt level: O2

StringBlock * google::protobuf::internal::StringBlock::Emplace(void *p,size_t n,StringBlock *next)

{
  ushort uVar1;
  string *psVar2;
  ushort uVar3;
  ushort uVar4;
  ushort local_2a;
  ulong local_28 [2];
  
  uVar4 = (ushort)n;
  if (next == (StringBlock *)0x0) {
    local_28[0] = 0x100;
  }
  else {
    local_28[0] = (ulong)next->next_size_;
  }
  local_2a = uVar4;
  psVar2 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_short,unsigned_long>
                     (&local_2a,local_28,"count == NextSize(next)");
  if (psVar2 == (string *)0x0) {
    uVar3 = 0x2000;
    if ((ushort)(uVar4 * 2) < 0x2000) {
      uVar3 = uVar4 * 2;
    }
    uVar1 = 0x100;
    if (next != (StringBlock *)0x0) {
      uVar1 = uVar3;
    }
    *(StringBlock **)p = next;
    *(ushort *)((long)p + 8) = uVar4 - (uVar4 & 0x1f ^ 0x10);
    *(ushort *)((long)p + 10) = uVar1;
    *(undefined1 *)((long)p + 0xc) = 0;
    return (StringBlock *)p;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/string_block.h"
             ,0x7d,psVar2->_M_string_length,(psVar2->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

inline StringBlock* StringBlock::Emplace(void* p, size_t n, StringBlock* next) {
  const auto count = static_cast<size_type>(n);
  ABSL_DCHECK_EQ(count, NextSize(next));
  size_type doubled = count * 2;
  size_type next_size = next ? std::min(doubled, max_size()) : min_size();
  return new (p) StringBlock(next, false, RoundedSize(count), next_size);
}